

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O3

void dma_heap_deinit(void)

{
  int __fd;
  long lVar1;
  
  lVar1 = 0;
  do {
    __fd = *(int *)((long)&heap_infos[0].fd + lVar1);
    if (0 < __fd) {
      close(__fd);
      *(undefined4 *)((long)&heap_infos[0].fd + lVar1) = 0xffffffff;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  return;
}

Assistant:

__attribute__ ((destructor))
void dma_heap_deinit(void)
{
    RK_U32 i;

    for (i = 0; i < MPP_ARRAY_ELEMS(heap_infos); i++) {
        DmaHeapInfo *info = &heap_infos[i];

        if (info->fd > 0) {
            close(info->fd);
            info->fd = -1;
        }
    }
}